

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

size_t __thiscall c4::yml::Tree::num_tag_directives(Tree *this)

{
  bool bVar1;
  size_t i;
  Tree *this_local;
  
  i = 0;
  while( true ) {
    if (3 < i) {
      return 4;
    }
    bVar1 = true;
    if (this->m_tag_directives[i].handle.len != 0) {
      bVar1 = this->m_tag_directives[i].handle.str == (char *)0x0;
    }
    if (bVar1) break;
    i = i + 1;
  }
  return i;
}

Assistant:

size_t Tree::num_tag_directives() const
{
    // this assumes we have a very small number of tag directives
    for(size_t i = 0; i < RYML_MAX_TAG_DIRECTIVES; ++i)
        if(m_tag_directives[i].handle.empty())
            return i;
    return RYML_MAX_TAG_DIRECTIVES;
}